

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterSparseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int32_t iVar12;
  undefined8 uVar13;
  int iVar14;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  DataKey DVar16;
  int *piVar17;
  long lVar18;
  ulong uVar19;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  pointer pnVar20;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_1fc;
  cpp_dec_float<100U,_int,_void> local_1e8;
  cpp_dec_float<100U,_int,_void> *local_190;
  pointer local_188;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_180;
  cpp_dec_float<100U,_int,_void> local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  byte local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  DVar16.info = 0;
  DVar16.idx = -1;
  pSVar15 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pnVar3 = (pSVar15->theTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_188 = (pSVar15->weights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  lVar18 = (long)(pSVar15->infeasibilitiesCo).super_IdxSet.num;
  if (0 < lVar18) {
    local_180 = &this->last;
    uVar19 = lVar18 + 1;
    local_1fc = -1;
    local_190 = &best->m_backend;
    do {
      pSVar15 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      piVar17 = (pSVar15->infeasibilitiesCo).super_IdxSet.idx;
      iVar2 = piVar17[uVar19 - 2];
      local_1e8.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_1e8.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
      local_1e8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
      local_1e8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_1e8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x30);
      local_1e8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_1e8.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_1e8.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_1e8.exp = pnVar3[iVar2].m_backend.exp;
      local_1e8.neg = pnVar3[iVar2].m_backend.neg;
      local_1e8.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_1e8.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      local_178.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_178.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_178.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_178.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_178.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_178.data._M_elems._40_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      local_178.data._M_elems._48_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      local_178.data._M_elems._56_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      local_178.exp = (feastol->m_backend).exp;
      local_178.neg = (feastol->m_backend).neg;
      local_178.fpclass = (feastol->m_backend).fpclass;
      local_178.prec_elem = (feastol->m_backend).prec_elem;
      if ((local_178.data._M_elems[0] | local_178.fpclass) != cpp_dec_float_finite) {
        local_178.neg = (bool)(local_178.neg ^ 1);
      }
      tol = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)CONCAT31((int3)((local_178.data._M_elems[0] | local_178.fpclass) >> 8),
                               local_178.fpclass != cpp_dec_float_NaN);
      if (local_1e8.fpclass == cpp_dec_float_NaN || local_178.fpclass == cpp_dec_float_NaN) {
LAB_00464bdd:
        iVar14 = (pSVar15->infeasibilitiesCo).super_IdxSet.num;
        (pSVar15->infeasibilitiesCo).super_IdxSet.num = iVar14 + -1;
        piVar17[uVar19 - 2] = piVar17[(long)iVar14 + -1];
        (pSVar15->isInfeasibleCo).data[iVar2] = 0;
        uVar13 = local_1e8.data._M_elems._48_8_;
        uVar4 = local_1e8._72_8_;
      }
      else {
        iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_1e8,&local_178);
        if (-1 < iVar14) {
          pSVar15 = (this->
                    super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thesolver;
          piVar17 = (pSVar15->infeasibilitiesCo).super_IdxSet.idx;
          goto LAB_00464bdd;
        }
        uStack_50 = CONCAT35(local_1e8.data._M_elems[0xf]._1_3_,local_1e8.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_1e8.data._M_elems._0_8_;
        auStack_80[0] = local_1e8.data._M_elems[2];
        auStack_80[1] = local_1e8.data._M_elems[3];
        local_78[0] = local_1e8.data._M_elems[4];
        local_78[1] = local_1e8.data._M_elems[5];
        auStack_70[0] = local_1e8.data._M_elems[6];
        auStack_70[1] = local_1e8.data._M_elems[7];
        local_68[0] = local_1e8.data._M_elems[8];
        local_68[1] = local_1e8.data._M_elems[9];
        auStack_60[0] = local_1e8.data._M_elems[10];
        auStack_60[1] = local_1e8.data._M_elems[0xb];
        local_58[0] = local_1e8.data._M_elems[0xc];
        local_58[1] = local_1e8.data._M_elems[0xd];
        local_48 = local_1e8.exp;
        local_44 = local_1e8.neg;
        local_40 = local_1e8.fpclass;
        iStack_3c = local_1e8.prec_elem;
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_188[iVar2].m_backend.data;
        local_d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_188[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_188[iVar2].m_backend.data + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_188[iVar2].m_backend.data + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_188[iVar2].m_backend.data + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = local_188[iVar2].m_backend.exp;
        local_d8.m_backend.neg = local_188[iVar2].m_backend.neg;
        local_d8.m_backend.fpclass = local_188[iVar2].m_backend.fpclass;
        local_d8.m_backend.prec_elem = local_188[iVar2].m_backend.prec_elem;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_178,local_88,&local_d8,&local_128,tol);
        uVar13._0_4_ = local_178.data._M_elems[0xc];
        uVar13._4_4_ = local_178.data._M_elems[0xd];
        local_1e8.data._M_elems[0xc] = local_178.data._M_elems[0xc];
        local_1e8.data._M_elems[0xd] = local_178.data._M_elems[0xd];
        local_1e8.data._M_elems._56_5_ = local_178.data._M_elems._56_5_;
        local_1e8.data._M_elems[0xf]._1_3_ = local_178.data._M_elems[0xf]._1_3_;
        local_1e8.data._M_elems[8] = local_178.data._M_elems[8];
        local_1e8.data._M_elems[9] = local_178.data._M_elems[9];
        local_1e8.data._M_elems[10] = local_178.data._M_elems[10];
        local_1e8.data._M_elems[0xb] = local_178.data._M_elems[0xb];
        local_1e8.data._M_elems[4] = local_178.data._M_elems[4];
        local_1e8.data._M_elems[5] = local_178.data._M_elems[5];
        local_1e8.data._M_elems[6] = local_178.data._M_elems[6];
        local_1e8.data._M_elems[7] = local_178.data._M_elems[7];
        local_1e8.data._M_elems[0] = local_178.data._M_elems[0];
        local_1e8.data._M_elems[1] = local_178.data._M_elems[1];
        local_1e8.data._M_elems[2] = local_178.data._M_elems[2];
        local_1e8.data._M_elems[3] = local_178.data._M_elems[3];
        local_1e8.exp = local_178.exp;
        local_1e8.neg = local_178.neg;
        uVar4._0_4_ = local_178.fpclass;
        uVar4._4_4_ = local_178.prec_elem;
        local_1e8.fpclass = local_178.fpclass;
        local_1e8.prec_elem = local_178.prec_elem;
        if (((local_178.fpclass != cpp_dec_float_NaN) && (local_190->fpclass != cpp_dec_float_NaN))
           && (iVar14 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                  (&local_1e8,local_190), uVar13 = local_1e8.data._M_elems._48_8_,
              uVar4 = local_1e8._72_8_, 0 < iVar14)) {
          pnVar20 = local_188 + iVar2;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 0xc) =
               local_1e8.data._M_elems._48_8_;
          *(ulong *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 0xe) =
               CONCAT35(local_1e8.data._M_elems[0xf]._1_3_,local_1e8.data._M_elems._56_5_);
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 8)
               = local_1e8.data._M_elems._32_8_;
          *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 10) =
               local_1e8.data._M_elems._40_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 4)
               = local_1e8.data._M_elems._16_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 6)
               = local_1e8.data._M_elems._24_8_;
          *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems =
               local_1e8.data._M_elems._0_8_;
          *(undefined8 *)((((cpp_dec_float<100U,_int,_void> *)&local_190->data)->data)._M_elems + 2)
               = local_1e8.data._M_elems._8_8_;
          local_190->exp = local_1e8.exp;
          local_190->neg = local_1e8.neg;
          local_190->fpclass = local_1e8.fpclass;
          local_190->prec_elem = local_1e8.prec_elem;
          uVar5 = *(undefined8 *)&(pnVar20->m_backend).data;
          uVar6 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 8);
          uVar7 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x10);
          uVar8 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x18);
          uVar9 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x20);
          uVar10 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x28);
          uVar11 = *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x38);
          *(undefined8 *)((local_180->m_backend).data._M_elems + 0xc) =
               *(undefined8 *)((long)&(pnVar20->m_backend).data + 0x30);
          *(undefined8 *)((local_180->m_backend).data._M_elems + 0xe) = uVar11;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 8) = uVar9;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 10) = uVar10;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 4) = uVar7;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 6) = uVar8;
          *(undefined8 *)(local_180->m_backend).data._M_elems = uVar5;
          *(undefined8 *)((local_180->m_backend).data._M_elems + 2) = uVar6;
          (this->last).m_backend.exp = (pnVar20->m_backend).exp;
          (this->last).m_backend.neg = (pnVar20->m_backend).neg;
          iVar12 = (pnVar20->m_backend).prec_elem;
          (this->last).m_backend.fpclass = (pnVar20->m_backend).fpclass;
          (this->last).m_backend.prec_elem = iVar12;
          local_1fc = iVar2;
        }
      }
      local_1e8._72_8_ = uVar4;
      local_1e8.data._M_elems._48_8_ = uVar13;
      uVar19 = uVar19 - 1;
    } while (1 < uVar19);
    DVar16.info = 0;
    DVar16.idx = -1;
    if (-1 < local_1fc) {
      DVar16 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::id((this->
                             super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).thesolver,local_1fc);
    }
  }
  return (SPxId)DVar16;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterSparseCoDim(R& best, R feastol)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int enterIdx = -1;
   int idx;
   R x;

   assert(this->thesolver->weights.dim() == this->thesolver->test().dim());

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         x = devexpr::computePrice(x, pen[idx], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = idx;
            last = pen[idx];
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}